

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  ImGuiContext *pIVar1;
  int i_stop;
  ImGuiWindow *pIVar2;
  int i_start;
  
  pIVar1 = GImGui;
  pIVar2 = GImGui->NavWindowingTarget;
  if (pIVar2 != (ImGuiWindow *)0x0) {
    if ((pIVar2->Flags & 0x8000000) == 0) {
      i_stop = ImGui::FindWindowFocusIndex(pIVar2);
      pIVar2 = FindWindowNavFocusable(i_stop + focus_change_dir,-0x7fffffff,focus_change_dir);
      if (pIVar2 == (ImGuiWindow *)0x0) {
        i_start = 0;
        if (focus_change_dir < 0) {
          i_start = (pIVar1->WindowsFocusOrder).Size + -1;
        }
        pIVar2 = FindWindowNavFocusable(i_start,i_stop,focus_change_dir);
      }
      if (pIVar2 != (ImGuiWindow *)0x0) {
        pIVar1->NavWindowingTargetAnim = pIVar2;
        pIVar1->NavWindowingTarget = pIVar2;
      }
      pIVar1->NavWindowingToggleLayer = false;
    }
    return;
  }
  __assert_fail("g.NavWindowingTarget",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x254d,"void NavUpdateWindowingHighlightWindow(int)");
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
    g.NavWindowingToggleLayer = false;
}